

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucoseCmd.cpp
# Opt level: O0

int Abc_CommandGlucose(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Glucose_Pars GVar2;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  Glucose_Pars pPars;
  int nConfls;
  int verb;
  int pre;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nConfls = 1;
  pPars.nConfls = 0;
  pPars.cust = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Cpvh");
      if (iVar1 == -1) {
        GVar2 = Glucose_CreatePars(nConfls,pPars.nConfls,0,pPars.cust);
        local_58._0_8_ = GVar2._0_8_;
        local_48 = (undefined1  [8])local_58._0_8_;
        local_58._8_8_ = GVar2._8_8_;
        pPars.pre = local_58._8_4_;
        pPars.verb = local_58._12_4_;
        if (argc == globalUtilOptind + 1) {
          Glucose_SolveCnf(argv[globalUtilOptind],(Glucose_Pars *)local_48);
          return 0;
        }
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandGlucose(): There is no AIG.\n");
          return 1;
        }
        iVar1 = Glucose_SolveAig(pAbc->pGia,(Glucose_Pars *)local_48);
        if (iVar1 == 10) {
          Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
        }
        return 0;
      }
      if (iVar1 == 0x43) break;
      if (iVar1 == 0x68) goto LAB_00723128;
      if (iVar1 == 0x70) {
        nConfls = nConfls ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_00723128;
        pPars.nConfls = pPars.nConfls ^ 1;
      }
    }
    if (argc <= globalUtilOptind) break;
    pPars.cust = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (pPars.cust < 0) {
LAB_00723128:
      Abc_Print(-2,"usage: &glucose [-C num] [-pvh] <file.cnf>\n");
      Abc_Print(-2,"\t             run Glucose 3.0 by Gilles Audemard and Laurent Simon\n");
      Abc_Print(-2,"\t-C num     : conflict limit [default = %d]\n",(ulong)(uint)pPars.cust);
      Abc_Print(-2,"\t-p         : enable preprocessing [default = %d]\n",(ulong)(uint)nConfls);
      Abc_Print(-2,"\t-v         : verbosity [default = %d]\n",(ulong)(uint)pPars.nConfls);
      Abc_Print(-2,"\t-h         : print the command usage\n");
      Abc_Print(-2,"\t<file.cnf> : (optional) CNF file to solve\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
  goto LAB_00723128;
}

Assistant:

int Abc_CommandGlucose( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c       = 0;
    int pre     = 1;
    int verb    = 0;
    int nConfls = 0;

    Glucose_Pars pPars;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cpvh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'C':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                    goto usage;
                }
                nConfls = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nConfls < 0 )
                    goto usage;
                break;
            case 'p':
                pre ^= 1;
                break;
            case 'v':
                verb ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }

    pPars = Glucose_CreatePars(pre,verb,0,nConfls);

    if ( argc == globalUtilOptind + 1 )
    {
        Glucose_SolveCnf( argv[globalUtilOptind], &pPars );
        return 0;
    }

    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandGlucose(): There is no AIG.\n" );
        return 1;
    }
    
    if ( Glucose_SolveAig( pAbc->pGia, &pPars ) == 10 )
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );

    return 0;
    
usage:
    Abc_Print( -2, "usage: &glucose [-C num] [-pvh] <file.cnf>\n" );
    Abc_Print( -2, "\t             run Glucose 3.0 by Gilles Audemard and Laurent Simon\n" );
    Abc_Print( -2, "\t-C num     : conflict limit [default = %d]\n",  nConfls );
    Abc_Print( -2, "\t-p         : enable preprocessing [default = %d]\n",pre);
    Abc_Print( -2, "\t-v         : verbosity [default = %d]\n",verb);
    Abc_Print( -2, "\t-h         : print the command usage\n");
    Abc_Print( -2, "\t<file.cnf> : (optional) CNF file to solve\n");
    return 1;
}